

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_rune * nk_textedit_createundo(nk_text_undo_state *state,int pos,int insert_len,int delete_len)

{
  short sVar1;
  short sVar2;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    nk_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    while( true ) {
      sVar1 = state->undo_char_point;
      if (sVar1 + insert_len < 1000) break;
      nk_textedit_discard_undo(state);
    }
    sVar2 = state->undo_point;
    state->undo_point = sVar2 + 1;
    state->undo_rec[sVar2].where = pos;
    state->undo_rec[sVar2].insert_length = (short)insert_len;
    state->undo_rec[sVar2].delete_length = (short)delete_len;
    if (insert_len != 0) {
      state->undo_rec[sVar2].char_storage = sVar1;
      state->undo_char_point = sVar1 + (short)insert_len;
      return state->undo_char + (int)sVar1;
    }
    state->undo_rec[sVar2].char_storage = -1;
  }
  else {
    state->undo_point = 0;
    state->undo_char_point = 0;
  }
  return (nk_rune *)0x0;
}

Assistant:

NK_INTERN nk_rune*
nk_textedit_createundo(struct nk_text_undo_state *state, int pos,
int insert_len, int delete_len)
{
struct nk_text_undo_record *r = nk_textedit_create_undo_record(state, insert_len);
if (r == 0)
return 0;

r->where = pos;
r->insert_length = (short) insert_len;
r->delete_length = (short) delete_len;

if (insert_len == 0) {
r->char_storage = -1;
return 0;
} else {
r->char_storage = state->undo_char_point;
state->undo_char_point = (short)(state->undo_char_point +  insert_len);
return &state->undo_char[r->char_storage];
}
}